

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputImpl.cpp
# Opt level: O1

void sf::priv::InputImpl::setMousePosition(Vector2i *position)

{
  Display *display;
  
  display = OpenDisplay();
  XWarpPointer(display,0,
               *(undefined8 *)
                (*(long *)(display + 0xe8) + 0x10 + (long)*(int *)(display + 0xe0) * 0x80),0,0,0,0,
               position->x,position->y);
  XFlush(display);
  CloseDisplay(display);
  return;
}

Assistant:

void InputImpl::setMousePosition(const Vector2i& position)
{
    // Open a connection with the X server
    Display* display = OpenDisplay();

    XWarpPointer(display, None, DefaultRootWindow(display), 0, 0, 0, 0, position.x, position.y);
    XFlush(display);

    // Close the connection with the X server
    CloseDisplay(display);
}